

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::TENSOR_SWAP_AXIS_Test::TestBody(TENSOR_SWAP_AXIS_Test *this)

{
  array<unsigned_int,_3UL> size;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_06;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_07;
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  vector<int,_std::allocator<int>_> *local_410;
  vector<int,_std::allocator<int>_> *local_3f8;
  vector<int,_std::allocator<int>_> *local_3e0;
  exception *e;
  Message local_348;
  int local_340;
  array<unsigned_int,_3UL> local_33c;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_3;
  Message local_318;
  int local_310;
  array<unsigned_int,_3UL> local_30c;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_2;
  Message local_2e8;
  int local_2e0;
  array<unsigned_int,_3UL> local_2dc;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_1;
  Message local_2b8;
  int local_2b0;
  array<unsigned_int,_3UL> local_2ac;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_26d;
  undefined1 local_26c;
  allocator<std::vector<int,_std::allocator<int>_>_> local_26b;
  undefined1 local_26a;
  allocator<int> local_269;
  int local_268 [4];
  iterator local_258;
  size_type local_250;
  allocator<int> local_241;
  int local_240 [4];
  iterator local_230;
  size_type local_228;
  allocator<int> local_219;
  int local_218 [4];
  iterator local_208;
  size_type local_200;
  vector<int,_std::allocator<int>_> *local_1f8;
  vector<int,_std::allocator<int>_> local_1f0;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1c0;
  undefined1 local_1a8 [22];
  undefined1 local_192;
  allocator<int> local_191;
  int local_190 [4];
  iterator local_180;
  size_type local_178;
  allocator<int> local_169;
  int local_168 [4];
  iterator local_158;
  size_type local_150;
  allocator<int> local_131;
  int local_130 [4];
  iterator local_120;
  size_type local_118;
  vector<int,_std::allocator<int>_> *local_110;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  undefined1 local_78 [40];
  undefined1 local_50 [8];
  tensor<int,_3U> ts;
  TENSOR_SWAP_AXIS_Test *this_local;
  
  local_26c = 1;
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_a8;
  local_192 = 1;
  local_130[0] = 1;
  local_130[1] = 2;
  local_130[2] = 3;
  local_130[3] = 4;
  local_120 = local_130;
  local_118 = 4;
  local_110 = &local_108;
  ts._56_8_ = this;
  std::allocator<int>::allocator(&local_131);
  __l_05._M_len = local_118;
  __l_05._M_array = local_120;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__l_05,&local_131);
  local_168[0] = 5;
  local_168[1] = 6;
  local_168[2] = 7;
  local_168[3] = 8;
  local_158 = local_168;
  local_150 = 4;
  local_110 = &local_f0;
  std::allocator<int>::allocator(&local_169);
  __l_04._M_len = local_150;
  __l_04._M_array = local_158;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_04,&local_169);
  local_190[0] = 9;
  local_190[1] = 10;
  local_190[2] = 0xb;
  local_190[3] = 0xc;
  local_180 = local_190;
  local_178 = 4;
  local_110 = &local_d8;
  std::allocator<int>::allocator(&local_191);
  __l_03._M_len = local_178;
  __l_03._M_array = local_180;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_03,&local_191);
  local_192 = 0;
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_108;
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_1a8 + 0x15));
  __l_06._M_len =
       (size_type)
       local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_06._M_array =
       (iterator)
       local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_a8,__l_06,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)(local_1a8 + 0x15));
  local_26a = 1;
  local_218[0] = 1;
  local_218[1] = 2;
  local_218[2] = 3;
  local_218[3] = 4;
  local_208 = local_218;
  local_200 = 4;
  local_1f8 = &local_1f0;
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_90;
  std::allocator<int>::allocator(&local_219);
  __l_01._M_len = local_200;
  __l_01._M_array = local_208;
  std::vector<int,_std::allocator<int>_>::vector(&local_1f0,__l_01,&local_219);
  local_240[0] = 5;
  local_240[1] = 6;
  local_240[2] = 7;
  local_240[3] = 8;
  local_230 = local_240;
  local_228 = 4;
  local_1f8 = &local_1d8;
  std::allocator<int>::allocator(&local_241);
  __l_00._M_len = local_228;
  __l_00._M_array = local_230;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d8,__l_00,&local_241);
  local_268[0] = 9;
  local_268[1] = 10;
  local_268[2] = 0xb;
  local_268[3] = 0xc;
  local_258 = local_268;
  local_250 = 4;
  local_1f8 = &local_1c0;
  std::allocator<int>::allocator(&local_269);
  __l._M_len = local_250;
  __l._M_array = local_258;
  std::vector<int,_std::allocator<int>_>::vector(&local_1c0,__l,&local_269);
  local_26a = 0;
  local_1a8._0_8_ = &local_1f0;
  local_1a8._8_8_ = (pointer)0x3;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_26b);
  __l_02._M_len = local_1a8._8_8_;
  __l_02._M_array = (iterator)local_1a8._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_90,__l_02,&local_26b);
  local_26c = 0;
  local_78._0_8_ = &local_a8;
  local_78._8_8_ = (pointer)0x2;
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::allocator(&local_26d);
  __l_07._M_len = local_78._8_8_;
  __l_07._M_array = (iterator)local_78._0_8_;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)(local_78 + 0x10),__l_07,&local_26d);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000002;
  size._M_elems[2] = 4;
  size._M_elems[0] = 2;
  size._M_elems[1] = 3;
  dnet::data_types::tensor<int,_3U>::tensor
            ((tensor<int,_3U> *)local_50,(type *)(local_78 + 0x10),size);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)(local_78 + 0x10));
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~allocator(&local_26d);
  local_3e0 = (vector<int,_std::allocator<int>_> *)local_78;
  do {
    local_3e0 = local_3e0 + -1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_3e0);
  } while (local_3e0 != &local_a8);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_26b);
  local_3f8 = (vector<int,_std::allocator<int>_> *)local_1a8;
  do {
    local_3f8 = local_3f8 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_3f8);
  } while (local_3f8 != &local_1f0);
  std::allocator<int>::~allocator(&local_269);
  std::allocator<int>::~allocator(&local_241);
  std::allocator<int>::~allocator(&local_219);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)(local_1a8 + 0x15));
  local_410 = &local_c0;
  do {
    local_410 = local_410 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_410);
  } while (local_410 != &local_108);
  std::allocator<int>::~allocator(&local_191);
  std::allocator<int>::~allocator(&local_169);
  std::allocator<int>::~allocator(&local_131);
  local_2ac._M_elems[0] = 1;
  local_2ac._M_elems[1] = 1;
  local_2ac._M_elems[2] = 2;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_2ac);
  local_2b0 = 7;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2a0,"(ts[{1, 1, 2}])","7",piVar2,&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  dnet::data_types::tensor<int,_3U>::swap_axis((tensor<int,_3U> *)local_50,1,2);
  local_2dc._M_elems[0] = 1;
  local_2dc._M_elems[1] = 2;
  local_2dc._M_elems[2] = 1;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_2dc);
  local_2e0 = 7;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2d0,"(ts[{1, 2, 1}])","7",piVar2,&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  dnet::data_types::tensor<int,_3U>::swap_axis((tensor<int,_3U> *)local_50,0,1);
  local_30c._M_elems[0] = 2;
  local_30c._M_elems[1] = 1;
  local_30c._M_elems[2] = 1;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_30c);
  local_310 = 7;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_300,"(ts[{2, 1, 1}])","7",piVar2,&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_33c._M_elems[0] = 3;
  local_33c._M_elems[1] = 0;
  local_33c._M_elems[2] = 1;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_33c);
  local_340 = 8;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_330,"(ts[{3, 0, 1}])","8",piVar2,&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&e,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&e,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&e);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  dnet::data_types::tensor<int,_3U>::~tensor((tensor<int,_3U> *)local_50);
  return;
}

Assistant:

TEST(TENSOR, SWAP_AXIS) {
        try {
            tensor<int, 3> ts({
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      },
                                      {
                                              {1, 2, 3, 4},
                                              {5, 6, 7, 8},
                                              {9, 10, 11, 12}
                                      }
                              }, {2, 3, 4});
            EXPECT_EQ((ts[{1, 1, 2}]), 7);
            ts.swap_axis(1, 2);
            EXPECT_EQ((ts[{1, 2, 1}]), 7);
            ts.swap_axis(0, 1);
            EXPECT_EQ((ts[{2, 1, 1}]), 7);
            EXPECT_EQ((ts[{3, 0, 1}]), 8);
        }
        catch (const dnet::misc::exception &e) {
            std::cout << e << std::endl;
        }
    }